

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>
          (Node *this,string *name,FBXExportProperty *more)

{
  FBXExportProperty local_b0;
  undefined1 local_90 [8];
  Node c;
  FBXExportProperty *more_local;
  string *name_local;
  Node *this_local;
  
  c.property_start = (size_t)more;
  Node((Node *)local_90,name);
  FBX::FBXExportProperty::FBXExportProperty(&local_b0,more);
  AddProperties<Assimp::FBX::FBXExportProperty>((Node *)local_90,&local_b0);
  FBX::FBXExportProperty::~FBXExportProperty(&local_b0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_90);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }